

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O1

void processFile(MidiFile *midifile,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  MidiEventList *pMVar6;
  MidiEvent *this;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int index;
  string temperament;
  string local_68;
  string local_48;
  
  smf::MidiFile::joinTracks(midifile);
  index = 0;
  pMVar6 = smf::MidiFile::operator[](midifile,0);
  iVar5 = smf::MidiEventList::getEventCount(pMVar6);
  if (0 < iVar5) {
    do {
      pMVar6 = smf::MidiFile::operator[](midifile,0);
      this = smf::MidiEventList::operator[](pMVar6,index);
      bVar4 = smf::MidiMessage::isPatchChange(&this->super_MidiMessage);
      if ((bVar4) &&
         (puVar3 = (this->super_MidiMessage).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish != puVar3)) {
        (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      bVar4 = smf::MidiMessage::isNote(&this->super_MidiMessage);
      if (bVar4) {
        iVar5 = smf::MidiMessage::getChannel(&this->super_MidiMessage);
        if (iVar5 != 9) {
          iVar5 = smf::MidiMessage::getKeyNumber(&this->super_MidiMessage);
          iVar5 = iVar5 + (((uint)(iVar5 / 6 + (iVar5 >> 0x1f)) >> 1) - (iVar5 >> 0x1f)) * -0xc;
          smf::MidiMessage::setChannel(&this->super_MidiMessage,(uint)(8 < iVar5) + iVar5);
        }
      }
      index = index + 1;
      pMVar6 = smf::MidiFile::operator[](midifile,0);
      iVar5 = smf::MidiEventList::getEventCount(pMVar6);
    } while (index < iVar5);
  }
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"type-0","");
  bVar4 = smf::Options::getBoolean(options,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (!bVar4) {
    smf::MidiFile::splitTracks(midifile);
  }
  removeInstruments(midifile);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"instrument","");
  iVar5 = smf::Options::getInteger(options,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  applyInstrument(midifile,iVar5);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"base-pitch-class","");
  smf::Options::getInteger(options,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"temperament","");
  smf::Options::getString(&local_48,options,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"pythagorean","");
  bVar4 = smf::Options::getBoolean(options,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x1292c0);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"meantone","");
  bVar4 = smf::Options::getBoolean(options,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x1292cc);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"kirnberger3","");
  bVar4 = smf::Options::getBoolean(options,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x1292d5);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"valotti","");
  bVar4 = smf::Options::getBoolean(options,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x1292e1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"bad","");
  bVar4 = smf::Options::getBoolean(options,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x1292e9);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"weird","");
  bVar4 = smf::Options::getBoolean(options,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x1291cd);
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"equal","");
  bVar4 = smf::Options::getBoolean(options,&local_68);
  iVar5 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
    iVar5 = extraout_EDX_00;
  }
  if (bVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)local_48._M_string_length,0x1292ed);
    iVar5 = extraout_EDX_01;
  }
  applyTemperament(midifile,&local_48,iVar5);
  smf::MidiFile::sortTracksNoteOnsBeforeOffs(midifile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void processFile(MidiFile& midifile, Options& options) {
	midifile.joinTracks();
	for (int e=0; e<midifile[0].getEventCount(); e++) {
		MidiEvent *curNote = &midifile[0][e];
		if (curNote->isPatchChange()) {
			curNote->clear();
		}
		if (!curNote->isNote()) {
			continue;
		}
		int chan = curNote->getChannel();
		if (chan == 0x09) {
			// ignore drum track
			continue;
		}
		int pitch = curNote->getKeyNumber();
		int pc = pitch % 12;
		int newchan = (pc < 0x09) ? pc : pc + 1;
		curNote->setChannel(newchan);
	}

	if (!options.getBoolean("type-0")) {
		midifile.splitTracks();
	}

	removeInstruments(midifile);
	int instrumentCode = options.getInteger("instrument");
	applyInstrument(midifile, instrumentCode);

	int base = options.getInteger("base-pitch-class");
	if (base < 0) {
		base = 0;
	} else if (base > 11) {
		base = base % 12;
	}
	string temperament = options.getString("temperament");
	if (options.getBoolean("pythagorean")) {
		temperament = "pythagorean";
	}
	if (options.getBoolean("meantone")) {
		temperament = "meantone";
	}
	if (options.getBoolean("kirnberger3")) {
		temperament = "kirnberger3";
	}
	if (options.getBoolean("valotti")) {
		temperament = "valotti";
	}
	if (options.getBoolean("bad")) {
		temperament = "bad";
	}
	if (options.getBoolean("weird")) {
		temperament = "weird";
	}
	if (options.getBoolean("equal")) {
		temperament = "equal";
	}
	applyTemperament(midifile, temperament, base);

	midifile.sortTracks();
}